

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getShortRangePotential(Snapshot *this)

{
  Snapshot *this_local;
  
  if ((this->hasShortRangePotential & 1U) == 0) {
    (this->frameData).shortRangePotential = (this->frameData).bondPotential;
    (this->frameData).shortRangePotential =
         (this->frameData).bendPotential + (this->frameData).shortRangePotential;
    (this->frameData).shortRangePotential =
         (this->frameData).torsionPotential + (this->frameData).shortRangePotential;
    (this->frameData).shortRangePotential =
         (this->frameData).inversionPotential + (this->frameData).shortRangePotential;
    this->hasShortRangePotential = true;
    this->hasPotentialEnergy = false;
    this->hasTotalEnergy = false;
  }
  return (this->frameData).shortRangePotential;
}

Assistant:

RealType Snapshot::getShortRangePotential() {
    if (!hasShortRangePotential) {
      frameData.shortRangePotential = frameData.bondPotential;
      frameData.shortRangePotential += frameData.bendPotential;
      frameData.shortRangePotential += frameData.torsionPotential;
      frameData.shortRangePotential += frameData.inversionPotential;
      hasShortRangePotential = true;
      hasPotentialEnergy     = false;
      hasTotalEnergy         = false;
    }
    return frameData.shortRangePotential;
  }